

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::reallocate_with_gap(Fl_Text_Buffer *this,int newGapStart,int newGapLen)

{
  int iVar1;
  char *__src;
  int iVar2;
  char *__dest;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->mLength;
  __dest = (char *)malloc((long)(iVar1 + newGapLen));
  iVar2 = newGapLen + newGapStart;
  iVar5 = this->mGapStart;
  __src = this->mBuf;
  if (iVar5 < newGapStart) {
    memcpy(__dest,__src,(long)iVar5);
    iVar3 = this->mGapEnd;
    memcpy(__dest + iVar5,__src + iVar3,(long)(newGapStart - iVar5));
    iVar3 = (newGapStart - iVar5) + iVar3;
    iVar4 = iVar2;
    iVar5 = newGapStart;
  }
  else {
    memcpy(__dest,__src,(long)newGapStart);
    memcpy(__dest + iVar2,__src + newGapStart,(long)(iVar5 - newGapStart));
    iVar4 = newGapLen + iVar5;
    iVar3 = this->mGapEnd;
  }
  memcpy(__dest + iVar4,__src + iVar3,(long)(iVar1 - iVar5));
  free(__src);
  this->mBuf = __dest;
  this->mGapStart = newGapStart;
  this->mGapEnd = iVar2;
  return;
}

Assistant:

void Fl_Text_Buffer::reallocate_with_gap(int newGapStart, int newGapLen)
{
  char *newBuf = (char *) malloc(mLength + newGapLen);
  int newGapEnd = newGapStart + newGapLen;
  
  if (newGapStart <= mGapStart) {
    memcpy(newBuf, mBuf, newGapStart);
    memcpy(&newBuf[newGapEnd], &mBuf[newGapStart],
	   mGapStart - newGapStart);
    memcpy(&newBuf[newGapEnd + mGapStart - newGapStart],
	   &mBuf[mGapEnd], mLength - mGapStart);
  } else {			/* newGapStart > mGapStart */
    memcpy(newBuf, mBuf, mGapStart);
    memcpy(&newBuf[mGapStart], &mBuf[mGapEnd], newGapStart - mGapStart);
    memcpy(&newBuf[newGapEnd],
	   &mBuf[mGapEnd + newGapStart - mGapStart],
	   mLength - newGapStart);
  }
  free((void *) mBuf);
  mBuf = newBuf;
  mGapStart = newGapStart;
  mGapEnd = newGapEnd;
  }